

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O0

unsigned_short __thiscall
btAxisSweep3Internal<unsigned_short>::addHandle
          (btAxisSweep3Internal<unsigned_short> *this,btVector3 *aabbMin,btVector3 *aabbMax,
          void *pOwner,short collisionFilterGroup,short collisionFilterMask,btDispatcher *dispatcher
          ,void *multiSapProxy)

{
  unsigned_short index;
  Handle *pHVar1;
  btAxisSweep3Internal<unsigned_short> *in_RCX;
  btAxisSweep3Internal<unsigned_short> *in_RDI;
  undefined4 in_R8D;
  undefined2 in_R9W;
  void *in_stack_00000010;
  unsigned_short axis;
  unsigned_short limit;
  Handle *pHandle;
  unsigned_short handle;
  unsigned_short max [3];
  unsigned_short min [3];
  undefined4 in_stack_ffffffffffffff90;
  ushort uVar2;
  int in_stack_ffffffffffffffbc;
  int iVar3;
  ushort uVar4;
  undefined1 updateOverlaps;
  btVector3 *in_stack_ffffffffffffffc0;
  undefined2 in_stack_ffffffffffffffc8;
  unsigned_short in_stack_ffffffffffffffca;
  undefined2 in_stack_ffffffffffffffcc;
  undefined1 in_stack_ffffffffffffffce;
  undefined1 uVar5;
  undefined1 in_stack_ffffffffffffffcf;
  undefined1 updateOverlaps_00;
  btAxisSweep3Internal<unsigned_short> *in_stack_ffffffffffffffd0;
  unsigned_short in_stack_ffffffffffffffda;
  int axis_00;
  
  axis_00 = CONCAT22((short)in_R8D,in_R9W);
  quantize(in_stack_ffffffffffffffd0,
           (unsigned_short *)
           CONCAT17(in_stack_ffffffffffffffcf,
                    CONCAT16(in_stack_ffffffffffffffce,
                             CONCAT24(in_stack_ffffffffffffffcc,
                                      CONCAT22(in_stack_ffffffffffffffca,in_stack_ffffffffffffffc8))
                            )),in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  quantize(in_stack_ffffffffffffffd0,
           (unsigned_short *)
           CONCAT17(in_stack_ffffffffffffffcf,
                    CONCAT16(in_stack_ffffffffffffffce,
                             CONCAT24(in_stack_ffffffffffffffcc,
                                      CONCAT22(in_stack_ffffffffffffffca,in_stack_ffffffffffffffc8))
                            )),in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  index = allocHandle((btAxisSweep3Internal<unsigned_short> *)
                      CONCAT44(in_R8D,in_stack_ffffffffffffff90));
  uVar5 = (undefined1)index;
  updateOverlaps_00 = (undefined1)(index >> 8);
  pHVar1 = getHandle(in_RDI,index);
  (pHVar1->super_btBroadphaseProxy).m_uniqueId = (uint)CONCAT11(updateOverlaps_00,uVar5);
  (pHVar1->super_btBroadphaseProxy).m_clientObject = in_RCX;
  (pHVar1->super_btBroadphaseProxy).m_collisionFilterGroup = (short)((uint)axis_00 >> 0x10);
  (pHVar1->super_btBroadphaseProxy).m_collisionFilterMask = (short)axis_00;
  (pHVar1->super_btBroadphaseProxy).m_multiSapParentProxy = in_stack_00000010;
  iVar3 = (uint)(ushort)(in_RDI->m_numHandles << 1) << 0x10;
  while (uVar2 = (ushort)iVar3, uVar2 < 3) {
    in_RDI->m_pHandles->m_maxEdges[uVar2] = in_RDI->m_pHandles->m_maxEdges[uVar2] + 2;
    uVar4 = (ushort)((uint)iVar3 >> 0x10);
    in_RDI->m_pEdges[uVar2][(int)(uVar4 + 1)] = in_RDI->m_pEdges[uVar2][(int)(uVar4 - 1)];
    in_RDI->m_pEdges[uVar2][(int)(uVar4 - 1)].m_pos =
         *(unsigned_short *)(&stack0xffffffffffffffd6 + (ulong)uVar2 * 2);
    in_RDI->m_pEdges[uVar2][(int)(uVar4 - 1)].m_handle = CONCAT11(updateOverlaps_00,uVar5);
    in_RDI->m_pEdges[uVar2][uVar4].m_pos =
         *(unsigned_short *)(&stack0xffffffffffffffd0 + (ulong)uVar2 * 2);
    in_RDI->m_pEdges[uVar2][uVar4].m_handle = CONCAT11(updateOverlaps_00,uVar5);
    pHVar1->m_maxEdges[(ulong)uVar2 - 3] = uVar4 - 1;
    pHVar1->m_maxEdges[uVar2] = uVar4;
    iVar3 = CONCAT22(uVar4,uVar2 + 1);
  }
  sortMinDown(in_stack_ffffffffffffffd0,
              CONCAT13(updateOverlaps_00,CONCAT12(uVar5,in_stack_ffffffffffffffcc)),
              in_stack_ffffffffffffffca,(btDispatcher *)pHVar1,SUB41((uint)iVar3 >> 0x18,0));
  updateOverlaps = (undefined1)((uint)iVar3 >> 0x18);
  sortMaxDown(in_RCX,axis_00,in_stack_ffffffffffffffda,(btDispatcher *)in_stack_ffffffffffffffd0,
              (bool)updateOverlaps_00);
  sortMinDown(in_stack_ffffffffffffffd0,
              CONCAT13(updateOverlaps_00,CONCAT12(uVar5,in_stack_ffffffffffffffcc)),
              in_stack_ffffffffffffffca,(btDispatcher *)pHVar1,(bool)updateOverlaps);
  sortMaxDown(in_RCX,axis_00,in_stack_ffffffffffffffda,(btDispatcher *)in_stack_ffffffffffffffd0,
              (bool)updateOverlaps_00);
  sortMinDown(in_stack_ffffffffffffffd0,
              CONCAT13(updateOverlaps_00,CONCAT12(uVar5,in_stack_ffffffffffffffcc)),
              in_stack_ffffffffffffffca,(btDispatcher *)pHVar1,(bool)updateOverlaps);
  sortMaxDown(in_RCX,axis_00,in_stack_ffffffffffffffda,(btDispatcher *)in_stack_ffffffffffffffd0,
              (bool)updateOverlaps_00);
  return CONCAT11(updateOverlaps_00,uVar5);
}

Assistant:

BP_FP_INT_TYPE btAxisSweep3Internal<BP_FP_INT_TYPE>::addHandle(const btVector3& aabbMin,const btVector3& aabbMax, void* pOwner,short int collisionFilterGroup,short int collisionFilterMask,btDispatcher* dispatcher,void* multiSapProxy)
{
	// quantize the bounds
	BP_FP_INT_TYPE min[3], max[3];
	quantize(min, aabbMin, 0);
	quantize(max, aabbMax, 1);

	// allocate a handle
	BP_FP_INT_TYPE handle = allocHandle();
	

	Handle* pHandle = getHandle(handle);
	
	pHandle->m_uniqueId = static_cast<int>(handle);
	//pHandle->m_pOverlaps = 0;
	pHandle->m_clientObject = pOwner;
	pHandle->m_collisionFilterGroup = collisionFilterGroup;
	pHandle->m_collisionFilterMask = collisionFilterMask;
	pHandle->m_multiSapParentProxy = multiSapProxy;

	// compute current limit of edge arrays
	BP_FP_INT_TYPE limit = static_cast<BP_FP_INT_TYPE>(m_numHandles * 2);

	
	// insert new edges just inside the max boundary edge
	for (BP_FP_INT_TYPE axis = 0; axis < 3; axis++)
	{

		m_pHandles[0].m_maxEdges[axis] += 2;

		m_pEdges[axis][limit + 1] = m_pEdges[axis][limit - 1];

		m_pEdges[axis][limit - 1].m_pos = min[axis];
		m_pEdges[axis][limit - 1].m_handle = handle;

		m_pEdges[axis][limit].m_pos = max[axis];
		m_pEdges[axis][limit].m_handle = handle;

		pHandle->m_minEdges[axis] = static_cast<BP_FP_INT_TYPE>(limit - 1);
		pHandle->m_maxEdges[axis] = limit;
	}

	// now sort the new edges to their correct position
	sortMinDown(0, pHandle->m_minEdges[0], dispatcher,false);
	sortMaxDown(0, pHandle->m_maxEdges[0], dispatcher,false);
	sortMinDown(1, pHandle->m_minEdges[1], dispatcher,false);
	sortMaxDown(1, pHandle->m_maxEdges[1], dispatcher,false);
	sortMinDown(2, pHandle->m_minEdges[2], dispatcher,true);
	sortMaxDown(2, pHandle->m_maxEdges[2], dispatcher,true);


	return handle;
}